

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAdES.h
# Opt level: O0

bool __thiscall Extensions::Decode(Extensions *this,uchar *pIn,size_t cbIn,size_t *cbUsed)

{
  bool bVar1;
  size_t sStack_38;
  bool ret;
  size_t cbPrefix;
  size_t cbSize;
  size_t *cbUsed_local;
  size_t cbIn_local;
  uchar *pIn_local;
  Extensions *this_local;
  
  cbPrefix = 0;
  sStack_38 = 0;
  cbSize = (size_t)cbUsed;
  cbUsed_local = (size_t *)cbIn;
  cbIn_local = (size_t)pIn;
  pIn_local = (uchar *)this;
  bVar1 = DerBase::DecodeSequenceOf<Extension>
                    (pIn,cbIn,&stack0xffffffffffffffc8,&cbPrefix,&this->values);
  if (bVar1) {
    (this->super_DerBase).cbData = cbPrefix;
    *(size_t *)cbSize = cbPrefix + sStack_38;
  }
  return bVar1;
}

Assistant:

virtual bool Decode(const unsigned char * pIn, size_t cbIn, size_t & cbUsed) override
	{
		// This is actually a SEQUENCE, oddly, seems it should be a set
		// Extensions  ::=  SEQUENCE SIZE (1..MAX) OF Extension
		size_t cbSize = 0;
		size_t cbPrefix = 0;
		bool ret = DecodeSequenceOf(pIn, cbIn, cbPrefix, cbSize, values);

		if (ret)
		{
			cbData = cbSize;
			cbUsed = cbSize + cbPrefix;
		}

		return ret;
	}